

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::FullyConnectedLayer::FullyConnectedLayer
          (FullyConnectedLayer *this,size_t nInputs,size_t nOutputs,Activation *af)

{
  valarray<float> *pvVar1;
  Activation *af_local;
  size_t nOutputs_local;
  size_t nInputs_local;
  FullyConnectedLayer *this_local;
  
  ABackpropLayer::ABackpropLayer(&this->super_ABackpropLayer);
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__00162778;
  this->nInputs = nInputs;
  this->nOutputs = nOutputs;
  pvVar1 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar1,nInputs * nOutputs);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->weights,pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar1,nOutputs);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->bias,pvVar1);
  this->activationFunction = af;
  std::valarray<float>::valarray(&this->inducedLocalField,nOutputs);
  std::valarray<float>::valarray(&this->activationGrad,nOutputs);
  std::valarray<float>::valarray(&this->localGrad,nOutputs);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar1,nInputs * nOutputs);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->weightSensitivity,pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar1,nOutputs);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->biasSensitivity,pvVar1);
  std::valarray<float>::valarray(&this->propagatedErrors,nInputs);
  std::shared_ptr<notch::core::ALearningPolicy>::shared_ptr(&this->policy);
  return;
}

Assistant:

FullyConnectedLayer(size_t nInputs = 0, size_t nOutputs = 0,
                        const Activation &af = linearActivation)
        : nInputs(nInputs), nOutputs(nOutputs),
          weights(new Array(nInputs * nOutputs)), bias(new Array(nOutputs)),
          activationFunction(&af), inducedLocalField(nOutputs),
          activationGrad(nOutputs), localGrad(nOutputs),
          weightSensitivity(new Array(nInputs * nOutputs)),
          biasSensitivity(new Array(nOutputs)),
          propagatedErrors(nInputs) {}